

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O1

int serial_exitcode(Backend *be)

{
  return ~*(uint *)&be[-4].interactor | 0x7fffffff;
}

Assistant:

static int serial_exitcode(Backend *be)
{
    Serial *serial = container_of(be, Serial, backend);
    if (serial->fd >= 0)
        return -1;                     /* still connected */
    else
        /* Exit codes are a meaningless concept with serial ports */
        return INT_MAX;
}